

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall REPL::loop(REPL *this)

{
  AI *this_00;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  bool bVar2;
  istream *piVar3;
  ostream *poVar4;
  Position *other;
  char *other_00;
  char temp;
  int z;
  Position pos;
  string buffer;
  string command;
  istringstream ss;
  
  this_00 = &this->ai;
  do {
    buffer._M_string_length = 0;
    buffer.field_2._M_local_buf[0] = '\0';
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&buffer);
    if (buffer._M_string_length != 0) {
      std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&buffer,_S_in);
      command._M_dataplus._M_p = (pointer)&command.field_2;
      command._M_string_length = 0;
      command.field_2._M_local_buf[0] = '\0';
      std::operator>>((istream *)&ss,(string *)&command);
      bVar2 = std::operator==(&command,"START");
      if (bVar2) {
        pvVar1 = (this->ai).board;
        (this->ai).boardSize =
             ((long)(pvVar1->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar1->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18;
      }
      else {
        bVar2 = std::operator==(&command,"PLACE");
        if (bVar2) {
          piVar3 = std::operator>>((istream *)&ss,&temp);
          piVar3 = (istream *)std::istream::operator>>(piVar3,&pos.x);
          std::istream::operator>>(piVar3,&z);
          *(int *)(*(long *)&(this->board).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)pos.x + -1].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + -0x184 +
                  (long)temp * 4) = z;
        }
        else {
          bVar2 = std::operator==(&command,"DONE");
          if (bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cout,"OK");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          else {
            bVar2 = std::operator==(&command,"BEGIN");
            if (bVar2) {
              pos = AI::begin(this_00);
              AI::putChess(this_00,pos.x,pos.y,1);
              poVar4 = operator<<((ostream *)&std::cout,&pos);
              std::endl<char,std::char_traits<char>>(poVar4);
            }
            else {
              bVar2 = std::operator==(&command,"TURN");
              if (bVar2) {
                piVar3 = std::operator>>((istream *)&ss,&temp);
                std::istream::operator>>(piVar3,&z);
                z = z - 1;
                other = (Position *)(ulong)(uint)z;
                bVar2 = AI::putChess(this_00,z,temp + -0x61,2);
                if (bVar2) {
                  pos = AI::turn(this_00,other);
                  if (pos.x < 0) {
                    poVar4 = std::operator<<((ostream *)&std::cout,"PASS");
                  }
                  else {
                    AI::putChess(this_00,pos.x,pos.y,1);
                    poVar4 = operator<<((ostream *)&std::cout,&pos);
                  }
                  std::endl<char,std::char_traits<char>>(poVar4);
                }
                else {
                  poVar4 = std::operator<<((ostream *)&std::cout,"input error");
                  std::endl<char,std::char_traits<char>>(poVar4);
                }
              }
              else {
                other_00 = "PASS";
                bVar2 = std::operator==(&command,"PASS");
                if (bVar2) {
                  pos = AI::turn(this_00,(Position *)other_00);
                  if (pos.x < 0) {
                    poVar4 = std::operator<<((ostream *)&std::cout,"PASS");
                  }
                  else {
                    AI::putChess(this_00,pos.x,pos.y,1);
                    poVar4 = operator<<((ostream *)&std::cout,&pos);
                  }
                  std::endl<char,std::char_traits<char>>(poVar4);
                }
                else {
                  bVar2 = std::operator==(&command,"END");
                  if (bVar2) {
                    std::__cxx11::string::~string((string *)&command);
                    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
                    std::__cxx11::string::~string((string *)&buffer);
                    return;
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&command);
      std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    }
    std::__cxx11::string::~string((string *)&buffer);
  } while( true );
}

Assistant:

void REPL::loop() {
    while (true) {
        string buffer;
        getline(cin, buffer);
        if (buffer.empty()) continue;
        istringstream ss(buffer);

        string command;
        ss >> command;
        if (command == START) {
            ai.init();
        } else if (command == PLACE) {
            int x, y, z;
            char temp;
            ss >> temp >> y >> z;
            x = temp - 'a';
            --y;
            board[y][x] = z;
        } else if (command == DONE) {
            cout << "OK" << endl;
        } else if (command == BEGIN) {
            Position pos = ai.begin();
            ai.putChess(pos.x, pos.y, ME);
            cout << pos << endl;
        } else if (command == TURN) {
            int x, y;
            char temp;
            ss >> temp >> y;
            x = temp - 'a';
            --y;
            if (ai.putChess(y, x, OTHER)) {
                Position pos = ai.turn({x, y});
                if (pos.x >= 0) {
                    ai.putChess(pos.x, pos.y, ME);
                    cout << pos << endl;
                } else {
                    cout << PASS << endl;
                }
            } else {
                cout << "input error" << endl;
            }
        } else if (command == PASS) {
            Position pos = ai.turn({0, 0});
            if (pos.x >= 0) {
                ai.putChess(pos.x, pos.y, ME);
                cout << pos << endl;
            } else {
                cout << PASS << endl;
            }
        } else if (command == END) {
            break;
        }
        //printBoard();
    }
}